

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obmc_variance_sse4.c
# Opt level: O2

void highbd_12_obmc_variance
               (uint8_t *pre8,int pre_stride,int32_t *wsrc,int32_t *mask,int w,int h,uint *sse,
               int *sum)

{
  bool bVar1;
  int h_00;
  int iVar2;
  uint64_t sse64;
  int64_t sum64;
  ulong local_48;
  long local_40;
  ulong local_38;
  
  sum64 = 0;
  sse64 = 0;
  if (w == 4) {
    hbd_obmc_variance_w4(pre8,pre_stride,wsrc,mask,&sse64,&sum64,h);
  }
  else if (h * w < 0x201) {
    hbd_obmc_variance_w8n(pre8,pre_stride,wsrc,mask,&sse64,&sum64,w,h);
  }
  else {
    local_38 = 0x200 / (ulong)(uint)w;
    h_00 = (int)local_38;
    local_40 = (long)(h_00 * pre_stride);
    local_48 = (ulong)(uint)(h_00 * w);
    do {
      hbd_obmc_variance_w8n(pre8,pre_stride,wsrc,mask,&sse64,&sum64,w,h_00);
      pre8 = pre8 + local_40;
      wsrc = wsrc + local_48;
      mask = mask + local_48;
      iVar2 = h - h_00;
      bVar1 = h_00 <= h;
      h = iVar2;
    } while (iVar2 != 0 && bVar1);
  }
  *sum = (int)(sum64 + 8U >> 4);
  *sse = (uint)(sse64 + 0x80 >> 8);
  return;
}

Assistant:

static inline void highbd_12_obmc_variance(const uint8_t *pre8, int pre_stride,
                                           const int32_t *wsrc,
                                           const int32_t *mask, int w, int h,
                                           unsigned int *sse, int *sum) {
  int64_t sum64 = 0;
  uint64_t sse64 = 0;
  int max_pel_allowed_per_ovf = 512;
  if (w == 4) {
    hbd_obmc_variance_w4(pre8, pre_stride, wsrc, mask, &sse64, &sum64, h);
  } else if (w * h <= max_pel_allowed_per_ovf) {
    hbd_obmc_variance_w8n(pre8, pre_stride, wsrc, mask, &sse64, &sum64, w, h);
  } else {
    int h_per_ovf = max_pel_allowed_per_ovf / w;

    assert(max_pel_allowed_per_ovf % w == 0);
    do {
      hbd_obmc_variance_w8n(pre8, pre_stride, wsrc, mask, &sse64, &sum64, w,
                            h_per_ovf);
      pre8 += h_per_ovf * pre_stride;
      wsrc += h_per_ovf * w;
      mask += h_per_ovf * w;
      h -= h_per_ovf;
    } while (h > 0);
  }
  *sum = (int)ROUND_POWER_OF_TWO(sum64, 4);
  *sse = (unsigned int)ROUND_POWER_OF_TWO(sse64, 8);
}